

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkheader.cpp
# Opt level: O2

void __thiscall
QHttpNetworkHeaderPrivate::setContentLength(QHttpNetworkHeaderPrivate *this,qint64 length)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_58;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray((QByteArray *)&local_40,"Content-Length",-1);
  QByteArray::number((longlong)&QStack_58,(int)length);
  QHttpHeaderParser::setHeaderField(&this->parser,(QByteArray *)&local_40,(QByteArray *)&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkHeaderPrivate::setContentLength(qint64 length)
{
    setHeaderField("Content-Length", QByteArray::number(length));
}